

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  float_t fVar4;
  ifstream file;
  array<float,_128UL> buffer;
  beatnik b;
  long in_stack_ffffffffffee8588;
  
  re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::beatnik
            ((beatnik<float,_1024L,_128L,_2048L,_128L> *)&stack0xffffffffffee8988,48000.0);
  std::ifstream::ifstream(&stack0xffffffffffee8580,argv[1],_S_bin|_S_ate);
  lVar2 = std::istream::tellg();
  std::istream::seekg(&stack0xffffffffffee8580,0,0);
  while( true ) {
    lVar3 = std::istream::tellg();
    if (lVar2 <= lVar3) break;
    std::istream::read(&stack0xffffffffffee8580,(long)&stack0xffffffffffee8788);
    if (in_stack_ffffffffffee8588 != 0x200) break;
    bVar1 = re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::process
                      ((beatnik<float,_1024L,_128L,_2048L,_128L> *)&stack0xffffffffffee8988,
                       (span<const_float,_128L>)&stack0xffffffffffee8788);
    if (bVar1) {
      fVar4 = re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::estimate_tempo
                        ((beatnik<float,_1024L,_128L,_2048L,_128L> *)&stack0xffffffffffee8988);
      printf("%03.3f BPM\r",(double)fVar4);
      fflush(_stdout);
    }
  }
  fVar4 = re::beatnik::beatnik<float,_1024L,_128L,_2048L,_128L>::estimate_tempo
                    ((beatnik<float,_1024L,_128L,_2048L,_128L> *)&stack0xffffffffffee8988);
  printf("%03.3f BPM\n\n",(double)fVar4);
  std::ifstream::~ifstream(&stack0xffffffffffee8580);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	using beatnik = re::beatnik::beatnik<>;
	constexpr auto const step_size = beatnik::fft_step;
	constexpr auto const step_bytes = step_size * sizeof(beatnik::float_t);

	std::array<float, step_size> buffer;
	beatnik b(48000);

	Expects(argc >= 2);
	/* header-less sequence of mono f32 samples @ 48kHz */
	std::ifstream file(argv[1], std::ios::binary | std::ios::ate);
	auto length = file.tellg();
	file.seekg(0);

	while(file.tellg() < length) {
		file.read(reinterpret_cast<char*>(&buffer[0]), step_bytes);
		if (file.gcount() != step_bytes) break;
		if (b.process(buffer)) { /* estimate ready */
			printf("%03.3f BPM\r", b.estimate_tempo());
			fflush(stdout);
		}

	}
	printf("%03.3f BPM\n\n", b.estimate_tempo());
	return 0;
}